

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O3

int envy_bios_parse_dacload(envy_bios *bios)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  envy_bios_dacload_entry *peVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  char *__format;
  int iVar12;
  
  uVar7 = (bios->dacload).offset;
  iVar12 = 0;
  if (uVar7 != 0) {
    uVar8 = bios->length;
    if (uVar7 < uVar8) {
      (bios->dacload).version = bios->data[(uint)uVar7];
      iVar12 = 0;
    }
    else {
      (bios->dacload).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar7 = (bios->dacload).offset;
      uVar8 = bios->length;
      iVar12 = -0xe;
    }
    uVar11 = (ulong)uVar7;
    lVar5 = uVar11 + 1;
    if ((uint)lVar5 < uVar8) {
      (bios->dacload).hlen = bios->data[lVar5];
      iVar10 = 0;
    }
    else {
      (bios->dacload).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar5);
      uVar11 = (ulong)(bios->dacload).offset;
      uVar8 = bios->length;
      iVar10 = -0xe;
    }
    uVar9 = (uint)uVar11;
    lVar5 = uVar11 + 2;
    if ((uint)lVar5 < uVar8) {
      (bios->dacload).rlen = bios->data[lVar5];
      iVar3 = 0;
    }
    else {
      (bios->dacload).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar5);
      uVar9 = (uint)(bios->dacload).offset;
      uVar8 = bios->length;
      iVar3 = -0xe;
    }
    if ((uint)((ulong)uVar9 + 3) < uVar8) {
      (bios->dacload).entriesnum = bios->data[(ulong)uVar9 + 3];
      iVar4 = 0;
    }
    else {
      (bios->dacload).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    if (((iVar10 == 0 && iVar12 == 0) && iVar3 == 0) && iVar4 == 0) {
      envy_bios_block(bios,(uint)(bios->dacload).offset,
                      (uint)(bios->dacload).entriesnum * (uint)(bios->dacload).rlen +
                      (uint)(bios->dacload).hlen,"DACLOAD",-1);
      if (((bios->dacload).version & 0xef) == 0) {
        bVar1 = (bios->dacload).hlen;
        uVar11 = (ulong)bVar1;
        if (bVar1 < 4) {
          __format = "DACLOAD table header too short [%d < %d]\n";
        }
        else {
          bVar2 = (bios->dacload).rlen;
          if (3 < bVar2) {
            if (bVar1 != 4) {
              fprintf(_stderr,"DACLOAD table header longer than expected [%d > %d]\n",uVar11,4);
              bVar2 = (bios->dacload).rlen;
            }
            if (4 < bVar2) {
              envy_bios_parse_dacload_cold_1();
            }
            bVar1 = (bios->dacload).entriesnum;
            peVar6 = (envy_bios_dacload_entry *)calloc((ulong)bVar1,8);
            (bios->dacload).entries = peVar6;
            if (peVar6 == (envy_bios_dacload_entry *)0x0) {
              return -0xc;
            }
            if (bVar1 != 0) {
              peVar6 = (bios->dacload).entries;
              uVar7 = (ushort)(bios->dacload).hlen + (bios->dacload).offset;
              bVar1 = (bios->dacload).rlen;
              uVar11 = 0;
              do {
                peVar6[uVar11].offset = uVar7;
                if (bios->length <= uVar7 + 3) {
                  peVar6[uVar11].val = 0;
                  fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
                  goto LAB_00254d44;
                }
                peVar6[uVar11].val = *(uint32_t *)(bios->data + uVar7);
                uVar11 = uVar11 + 1;
                uVar7 = uVar7 + bVar1;
              } while (uVar11 < (bios->dacload).entriesnum);
            }
            (bios->dacload).valid = '\x01';
            return 0;
          }
          __format = "DACLOAD table record too short [%d < %d]\n";
          uVar11 = (ulong)(uint)bVar2;
        }
        fprintf(_stderr,__format,uVar11,4);
      }
      else {
        envy_bios_parse_dacload_cold_2();
      }
      iVar12 = -0x16;
    }
    else {
LAB_00254d44:
      iVar12 = -0xe;
    }
  }
  return iVar12;
}

Assistant:

int envy_bios_parse_dacload (struct envy_bios *bios) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	if (!dacload->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, dacload->offset, &dacload->version);
	err |= bios_u8(bios, dacload->offset+1, &dacload->hlen);
	err |= bios_u8(bios, dacload->offset+2, &dacload->rlen);
	err |= bios_u8(bios, dacload->offset+3, &dacload->entriesnum);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, dacload->offset, dacload->hlen + dacload->rlen * dacload->entriesnum, "DACLOAD", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (dacload->version) {
		case 0x00:
		case 0x10:
			wanthlen = 4;
			wantrlen = 4;
			break;
		default:
			ENVY_BIOS_ERR("Unknown DACLOAD table version %d.%d\n", dacload->version >> 4, dacload->version & 0xf);
			return -EINVAL;
	}
	if (dacload->hlen < wanthlen) {
		ENVY_BIOS_ERR("DACLOAD table header too short [%d < %d]\n", dacload->hlen, wanthlen);
		return -EINVAL;
	}
	if (dacload->rlen < wantrlen) {
		ENVY_BIOS_ERR("DACLOAD table record too short [%d < %d]\n", dacload->rlen, wantrlen);
		return -EINVAL;
	}
	if (dacload->hlen > wanthlen) {
		ENVY_BIOS_WARN("DACLOAD table header longer than expected [%d > %d]\n", dacload->hlen, wanthlen);
	}
	if (dacload->rlen > wantrlen) {
		ENVY_BIOS_WARN("DACLOAD table record longer than expected [%d > %d]\n", dacload->rlen, wantrlen);
	}
	dacload->entries = calloc(dacload->entriesnum, sizeof *dacload->entries);
	if (!dacload->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < dacload->entriesnum; i++) {
		struct envy_bios_dacload_entry *entry = &dacload->entries[i];
		entry->offset = dacload->offset + dacload->hlen + dacload->rlen * i;
		err |= bios_u32(bios, entry->offset, &entry->val);
		if (err)
			return -EFAULT;
	}
	dacload->valid = 1;
	return 0;
}